

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_ptr_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  SPIRExpression *pSVar2;
  string local_40;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,id);
  if ((pSVar2 == (SPIRExpression *)0x0) || (pSVar2->need_transpose != true)) {
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_40,&this->super_CompilerGLSL,id,register_expression_read);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,(string *)&pSVar2->expression);
  }
  CompilerGLSL::enclose_expression(__return_storage_ptr__,&this->super_CompilerGLSL,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = CompilerGLSL::should_dereference(&this->super_CompilerGLSL,id);
  if (!bVar1) {
    CompilerGLSL::address_of_expression(&local_40,&this->super_CompilerGLSL,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_ptr_expression(uint32_t id, bool register_expression_read)
{
	auto *e = maybe_get<SPIRExpression>(id);
	auto expr = enclose_expression(e && e->need_transpose ? e->expression : to_expression(id, register_expression_read));
	if (!should_dereference(id))
		expr = address_of_expression(expr);
	return expr;
}